

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimacs.cc
# Opt level: O1

InputGraph read_dimacs(ifstream *infile,string *filename)

{
  uint uVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  _Alloc_hider _Var4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  istream *piVar11;
  uint *puVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  GraphFileError *pGVar17;
  ulong *puVar18;
  regex *prVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string *in_RDX;
  uint __uval;
  int iVar22;
  uint __len;
  uint uVar23;
  string_view l;
  undefined1 auVar24 [16];
  string line;
  smatch match;
  string_type local_c0;
  _Head_base<0UL,_InputGraph::Imp_*,_false> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [32];
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_head_impl = (Imp *)infile;
  local_58 = in_RDX;
  InputGraph::InputGraph((InputGraph *)infile,0,false,false);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  do {
    do {
      cVar6 = std::ios::widen((char)*(undefined8 *)((filename->_M_dataplus)._M_p + -0x18) +
                              (char)filename);
      piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)filename,(string *)&local_98,cVar6);
      if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) {
        if ((*(byte *)((long)&filename[1]._M_dataplus._M_p +
                      *(long *)((filename->_M_dataplus)._M_p + -0x18)) & 2) == 0) {
          pGVar17 = (GraphFileError *)__cxa_allocate_exception(0x30);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,"error reading file","");
          GraphFileError::GraphFileError(pGVar17,local_58,(string *)local_78,true);
          __cxa_throw(pGVar17,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        uVar23 = 0;
        do {
          iVar8 = InputGraph::size((InputGraph *)local_a0._M_head_impl);
          if (iVar8 <= (int)uVar23) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                       local_98.field_2._M_local_buf[0]) + 1);
            }
            return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                   (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                   local_a0._M_head_impl;
          }
          uVar1 = uVar23 + 1;
          uVar20 = (ulong)uVar1;
          __len = 1;
          if (8 < uVar23) {
            uVar5 = 4;
            do {
              __len = uVar5;
              uVar10 = (uint)uVar20;
              if (uVar10 < 100) {
                __len = __len - 2;
                goto LAB_001461fa;
              }
              if (uVar10 < 1000) {
                __len = __len - 1;
                goto LAB_001461fa;
              }
              if (uVar10 < 10000) goto LAB_001461fa;
              uVar20 = uVar20 / 10000;
              uVar5 = __len + 4;
            } while (99999 < uVar10);
            __len = __len + 1;
          }
LAB_001461fa:
          local_78._0_8_ = (pointer)(local_78 + 0x10);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,(ulong)__len,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78._0_8_,__len,uVar1);
          l._M_str = (char *)local_78._0_8_;
          l._M_len = local_78._8_8_;
          InputGraph::set_vertex_name((InputGraph *)local_a0._M_head_impl,uVar23,l);
          uVar23 = uVar1;
          if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
          }
        } while( true );
      }
    } while (local_98._M_string_length == 0);
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     comment_abi_cxx11_), iVar8 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_,
                 "c(\\s.*)?",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                           comment_abi_cxx11_);
    }
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     problem_abi_cxx11_), iVar8 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_,
                 "p\\s+(edge|col)\\s+(\\d+)\\s+(\\d+)?\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                           problem_abi_cxx11_);
    }
    if ((read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                                     edge_abi_cxx11_), iVar8 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_,
                 "e\\s+(\\d+)\\s+(\\d+)\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_
                         );
    }
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    local_78._24_8_ = (char *)0x0;
    bVar7 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_98._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_98._M_dataplus._M_p + local_98._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_78,
                       &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::comment_abi_cxx11_
                       ,0);
    if (!bVar7) {
      prVar19 = &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::problem_abi_cxx11_;
      bVar7 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_98._M_dataplus._M_p,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_98._M_dataplus._M_p + local_98._M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_78,
                         &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                          problem_abi_cxx11_,0);
      if (bVar7) {
        iVar8 = InputGraph::size((InputGraph *)local_a0._M_head_impl);
        if (iVar8 != 0) {
          pGVar17 = (GraphFileError *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"multiple \'p\' lines encountered","");
          GraphFileError::GraphFileError(pGVar17,local_58,&local_c0,true);
          __cxa_throw(pGVar17,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_78,2);
        _Var4._M_p = local_c0._M_dataplus._M_p;
        puVar12 = (uint *)__errno_location();
        uVar23 = *puVar12;
        *puVar12 = 0;
        lVar13 = strtol(_Var4._M_p,(char **)&local_50,10);
        if (local_50._M_dataplus._M_p == _Var4._M_p) {
LAB_001463d0:
          std::__throw_invalid_argument("stoi");
        }
        else {
          prVar19 = (regex *)(lVar13 - 0x80000000);
          if ((regex *)0xfffffffeffffffff < prVar19) {
            uVar1 = *puVar12;
            prVar19 = (regex *)(ulong)uVar1;
            if (uVar1 != 0x22) {
              if (uVar1 == 0) {
                *puVar12 = uVar23;
              }
              InputGraph::resize((InputGraph *)local_a0._M_head_impl,(int)lVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_00146012;
            }
          }
        }
        std::__throw_out_of_range("stoi");
LAB_001463e8:
        auVar24 = std::__throw_invalid_argument("stoi");
      }
      else {
        prVar19 = &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::edge_abi_cxx11_;
        bVar7 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_98._M_dataplus._M_p,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_98._M_dataplus._M_p + local_98._M_string_length),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_78,
                           &read_dimacs(std::ifstream&&,std::__cxx11::string_const&)::
                            edge_abi_cxx11_,0);
        if (!bVar7) goto LAB_00146302;
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_78,1);
        _Var4._M_p = local_c0._M_dataplus._M_p;
        piVar14 = __errno_location();
        iVar8 = *piVar14;
        *piVar14 = 0;
        lVar13 = strtol(_Var4._M_p,(char **)&local_50,10);
        if (local_50._M_dataplus._M_p == _Var4._M_p) goto LAB_001463e8;
        if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar14 == 0x22)) {
LAB_001462f6:
          std::__throw_out_of_range("stoi");
LAB_00146302:
          pGVar17 = (GraphFileError *)__cxa_allocate_exception(0x30);
          std::operator+(&local_50,"cannot parse line \'",&local_98);
          pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_50,"\'");
          local_c0._M_dataplus._M_p = (pbVar16->_M_dataplus)._M_p;
          paVar21 = &pbVar16->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p == paVar21) {
            local_c0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
            local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          }
          local_c0._M_string_length = pbVar16->_M_string_length;
          (pbVar16->_M_dataplus)._M_p = (pointer)paVar21;
          pbVar16->_M_string_length = 0;
          (pbVar16->field_2)._M_local_buf[0] = '\0';
          GraphFileError::GraphFileError(pGVar17,local_58,&local_c0,true);
          __cxa_throw(pGVar17,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        if (*piVar14 == 0) {
          *piVar14 = iVar8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_c0,
              (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)local_78,2);
        _Var4._M_p = local_c0._M_dataplus._M_p;
        iVar8 = *piVar14;
        *piVar14 = 0;
        lVar15 = strtol(local_c0._M_dataplus._M_p,(char **)&local_50,10);
        if (local_50._M_dataplus._M_p == _Var4._M_p) {
          std::__throw_invalid_argument("stoi");
          goto LAB_001463d0;
        }
        if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar14 == 0x22)) {
          std::__throw_out_of_range("stoi");
          goto LAB_001462f6;
        }
        if (*piVar14 == 0) {
          *piVar14 = iVar8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        iVar8 = (int)lVar13;
        if ((((iVar8 != 0) && (iVar22 = (int)lVar15, iVar22 != 0)) &&
            (iVar9 = InputGraph::size((InputGraph *)local_a0._M_head_impl), iVar8 <= iVar9)) &&
           (iVar9 = InputGraph::size((InputGraph *)local_a0._M_head_impl), iVar22 <= iVar9)) {
          InputGraph::add_edge((InputGraph *)local_a0._M_head_impl,iVar8 + -1,iVar22 + -1);
          goto LAB_00146012;
        }
        filename = (string *)__cxa_allocate_exception(0x30);
        std::operator+(&local_50,"line \'",&local_98);
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_50,"\' edge index out of bounds");
        auVar3._8_8_ = &local_c0.field_2;
        auVar3._0_8_ = pbVar16;
        pcVar2 = (pbVar16->_M_dataplus)._M_p;
        auVar24._8_8_ = pcVar2;
        auVar24._0_8_ = pbVar16;
        prVar19 = (regex *)&pbVar16->field_2;
        if ((regex *)pcVar2 == prVar19) {
          local_c0.field_2._M_allocated_capacity = *(undefined8 *)prVar19;
          local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar16->field_2 + 8);
          goto LAB_00146401;
        }
      }
      local_c0.field_2._M_allocated_capacity = *(undefined8 *)prVar19;
      auVar3 = auVar24;
LAB_00146401:
      local_c0._M_dataplus._M_p = auVar3._8_8_;
      puVar18 = auVar3._0_8_;
      local_c0._M_string_length = puVar18[1];
      *puVar18 = (ulong)prVar19;
      puVar18[1] = 0;
      *(undefined1 *)(puVar18 + 2) = 0;
      GraphFileError::GraphFileError((GraphFileError *)filename,local_58,&local_c0,true);
      __cxa_throw(filename,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
LAB_00146012:
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
    }
  } while( true );
}

Assistant:

auto read_dimacs(ifstream && infile, const string & filename) -> InputGraph
{
    InputGraph result{0, false, false};

    string line;
    while (getline(infile, line)) {
        if (line.empty())
            continue;

        /* Lines are comments, a problem description (contains the number of
         * vertices), or an edge. */
        static const regex
            comment{R"(c(\s.*)?)"},
            problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
            edge{R"(e\s+(\d+)\s+(\d+)\s*)"};

        smatch match;
        if (regex_match(line, match, comment)) {
            /* Comment, ignore */
        }
        else if (regex_match(line, match, problem)) {
            /* Problem. Specifies the size of the graph. Must happen exactly
             * once. */
            if (0 != result.size())
                throw GraphFileError{filename, "multiple 'p' lines encountered", true};
            result.resize(stoi(match.str(2)));
        }
        else if (regex_match(line, match, edge)) {
            /* An edge. DIMACS files are 1-indexed. We assume we've already had
             * a problem line (if not our size will be 0, so we'll throw). */
            int a{stoi(match.str(1))}, b{stoi(match.str(2))};
            if (0 == a || 0 == b || a > result.size() || b > result.size())
                throw GraphFileError{filename, "line '" + line + "' edge index out of bounds", true};
            result.add_edge(a - 1, b - 1);
        }
        else
            throw GraphFileError{filename, "cannot parse line '" + line + "'", true};
    }

    if (! infile.eof())
        throw GraphFileError{filename, "error reading file", true};

    for (int v = 0; v < result.size(); ++v)
        result.set_vertex_name(v, to_string(v + 1));

    return result;
}